

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O0

_Bool unshield_reader_open_volume(UnshieldReader *reader,int volume)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  _Bool _Var4;
  uint32_t uVar5;
  FILE *pFVar6;
  size_t sVar7;
  uint8_t *p_2;
  uint8_t six_header [64];
  uint8_t *p_1;
  uint8_t five_header [40];
  uint8_t *p;
  uint8_t tmp [20];
  CommonHeader common_header;
  uint64_t volume_bytes_left_expanded;
  uint64_t volume_bytes_left_compressed;
  uint64_t data_offset;
  _Bool success;
  int volume_local;
  UnshieldReader *reader_local;
  
  data_offset._3_1_ = false;
  _unshield_log(3,"unshield_reader_open_volume",0x13b,"Open volume %i",(ulong)(uint)volume);
  if (reader->volume_file != (FILE *)0x0) {
    unshield_fclose(reader->unshield,reader->volume_file);
    reader->volume_file = (FILE *)0x0;
  }
  pFVar6 = unshield_fopen_for_reading(reader->unshield,volume,"cab");
  reader->volume_file = pFVar6;
  if (reader->volume_file == (FILE *)0x0) {
    _unshield_log(1,"unshield_reader_open_volume",0x143,"Failed to open input cabinet file %i",
                  (ulong)(uint)volume);
  }
  else {
    five_header._32_8_ = &p;
    sVar7 = unshield_fread(reader->unshield,&p,1,0x14,reader->volume_file);
    if ((sVar7 == 0x14) &&
       (_Var4 = unshield_read_common_header
                          ((uint8_t **)(five_header + 0x20),(CommonHeader *)(tmp + 0xc)), _Var4)) {
      (reader->volume_header).last_file_size_expanded = 0;
      (reader->volume_header).last_file_size_expanded_high = 0;
      (reader->volume_header).last_file_size_compressed = 0;
      (reader->volume_header).last_file_size_compressed_high = 0;
      (reader->volume_header).first_file_size_compressed = 0;
      (reader->volume_header).first_file_size_compressed_high = 0;
      (reader->volume_header).last_file_offset = 0;
      (reader->volume_header).last_file_offset_high = 0;
      (reader->volume_header).first_file_offset = 0;
      (reader->volume_header).first_file_offset_high = 0;
      (reader->volume_header).first_file_size_expanded = 0;
      (reader->volume_header).first_file_size_expanded_high = 0;
      (reader->volume_header).data_offset = 0;
      (reader->volume_header).data_offset_high = 0;
      (reader->volume_header).first_file_index = 0;
      (reader->volume_header).last_file_index = 0;
      iVar1 = reader->unshield->header_list->major_version;
      if ((iVar1 == 0) || (iVar1 == 5)) {
        sVar7 = unshield_fread(reader->unshield,&p_1,1,0x28,reader->volume_file);
        if (sVar7 != 0x28) {
          return false;
        }
        uVar5 = get_unaligned_le32((uint8_t *)&p_1);
        (reader->volume_header).data_offset = uVar5;
        uVar5 = get_unaligned_le32((uint8_t *)((long)&p_1 + 4));
        if (uVar5 != 0) {
          uVar5 = get_unaligned_le32((uint8_t *)((long)&p_1 + 4));
          _unshield_log(3,"unshield_reader_open_volume",0x163,"Unknown = %08x",(ulong)uVar5);
        }
        uVar5 = get_unaligned_le32(five_header);
        (reader->volume_header).first_file_index = uVar5;
        uVar5 = get_unaligned_le32(five_header + 4);
        (reader->volume_header).last_file_index = uVar5;
        uVar5 = get_unaligned_le32(five_header + 8);
        (reader->volume_header).first_file_offset = uVar5;
        uVar5 = get_unaligned_le32(five_header + 0xc);
        (reader->volume_header).first_file_size_expanded = uVar5;
        uVar5 = get_unaligned_le32(five_header + 0x10);
        (reader->volume_header).first_file_size_compressed = uVar5;
        uVar5 = get_unaligned_le32(five_header + 0x14);
        (reader->volume_header).last_file_offset = uVar5;
        uVar5 = get_unaligned_le32(five_header + 0x18);
        (reader->volume_header).last_file_size_expanded = uVar5;
        uVar5 = get_unaligned_le32(five_header + 0x1c);
        (reader->volume_header).last_file_size_compressed = uVar5;
        if ((reader->volume_header).last_file_offset == 0) {
          (reader->volume_header).last_file_offset = 0x7fffffff;
        }
      }
      else {
        sVar7 = unshield_fread(reader->unshield,&p_2,1,0x40,reader->volume_file);
        if (sVar7 != 0x40) {
          return false;
        }
        uVar5 = get_unaligned_le32((uint8_t *)&p_2);
        (reader->volume_header).data_offset = uVar5;
        uVar5 = get_unaligned_le32((uint8_t *)((long)&p_2 + 4));
        (reader->volume_header).data_offset_high = uVar5;
        uVar5 = get_unaligned_le32(six_header);
        (reader->volume_header).first_file_index = uVar5;
        uVar5 = get_unaligned_le32(six_header + 4);
        (reader->volume_header).last_file_index = uVar5;
        uVar5 = get_unaligned_le32(six_header + 8);
        (reader->volume_header).first_file_offset = uVar5;
        uVar5 = get_unaligned_le32(six_header + 0xc);
        (reader->volume_header).first_file_offset_high = uVar5;
        uVar5 = get_unaligned_le32(six_header + 0x10);
        (reader->volume_header).first_file_size_expanded = uVar5;
        uVar5 = get_unaligned_le32(six_header + 0x14);
        (reader->volume_header).first_file_size_expanded_high = uVar5;
        uVar5 = get_unaligned_le32(six_header + 0x18);
        (reader->volume_header).first_file_size_compressed = uVar5;
        uVar5 = get_unaligned_le32(six_header + 0x1c);
        (reader->volume_header).first_file_size_compressed_high = uVar5;
        uVar5 = get_unaligned_le32(six_header + 0x20);
        (reader->volume_header).last_file_offset = uVar5;
        uVar5 = get_unaligned_le32(six_header + 0x24);
        (reader->volume_header).last_file_offset_high = uVar5;
        uVar5 = get_unaligned_le32(six_header + 0x28);
        (reader->volume_header).last_file_size_expanded = uVar5;
        uVar5 = get_unaligned_le32(six_header + 0x2c);
        (reader->volume_header).last_file_size_expanded_high = uVar5;
        uVar5 = get_unaligned_le32(six_header + 0x30);
        (reader->volume_header).last_file_size_compressed = uVar5;
        uVar5 = get_unaligned_le32(six_header + 0x34);
        (reader->volume_header).last_file_size_compressed_high = uVar5;
      }
      _unshield_log(3,"unshield_reader_open_volume",0x19b,
                    "First file index = %i, last file index = %i",
                    (ulong)(reader->volume_header).first_file_index,
                    (ulong)(reader->volume_header).last_file_index);
      _unshield_log(3,"unshield_reader_open_volume",0x19d,
                    "First file offset = %08x, last file offset = %08x",
                    (ulong)(reader->volume_header).first_file_offset,
                    (ulong)(reader->volume_header).last_file_offset);
      if (reader->unshield->header_list->major_version == 5) {
        if (((reader->index < (reader->unshield->header_list->cab).file_count - 1) &&
            (reader->index == (reader->volume_header).last_file_index)) &&
           ((ulong)(reader->volume_header).last_file_size_compressed !=
            reader->file_descriptor->compressed_size)) {
          _unshield_log(3,"unshield_reader_open_volume",0x1a7,"IS5 split file last in volume");
          reader->file_descriptor->flags = reader->file_descriptor->flags | 1;
        }
        else if (((reader->index != 0) &&
                 (reader->index == (reader->volume_header).first_file_index)) &&
                ((ulong)(reader->volume_header).first_file_size_compressed !=
                 reader->file_descriptor->compressed_size)) {
          _unshield_log(3,"unshield_reader_open_volume",0x1ae,"IS5 split file first in volume");
          reader->file_descriptor->flags = reader->file_descriptor->flags | 1;
        }
      }
      if ((reader->file_descriptor->flags & 1) == 0) {
        volume_bytes_left_compressed = reader->file_descriptor->data_offset;
        common_header.cab_descriptor_offset = (uint32_t)reader->file_descriptor->expanded_size;
        volume_bytes_left_expanded._0_4_ = (uint)reader->file_descriptor->compressed_size;
      }
      else {
        _unshield_log(3,"unshield_reader_open_volume",0x1b7,"previous data offset = 0x08%x",0);
        if ((reader->index == (reader->volume_header).last_file_index) &&
           ((reader->volume_header).last_file_offset != 0x7fffffff)) {
          _unshield_log(3,"unshield_reader_open_volume",0x1bf,
                        "Index %i is last file in cabinet file %i",(ulong)reader->index,
                        (ulong)(uint)volume);
          uVar2 = (reader->volume_header).last_file_offset;
          common_header.cab_descriptor_offset = (reader->volume_header).last_file_size_expanded;
          uVar3 = (reader->volume_header).last_file_size_compressed;
        }
        else {
          if (reader->index != (reader->volume_header).first_file_index) {
            return true;
          }
          _unshield_log(3,"unshield_reader_open_volume",0x1ca,
                        "Index %i is first file in cabinet file %i",(ulong)reader->index,
                        (ulong)(uint)volume);
          uVar2 = (reader->volume_header).first_file_offset;
          common_header.cab_descriptor_offset = (reader->volume_header).first_file_size_expanded;
          uVar3 = (reader->volume_header).first_file_size_compressed;
        }
        volume_bytes_left_compressed = (uint64_t)uVar2;
        volume_bytes_left_expanded = (uint64_t)uVar3;
        _unshield_log(3,"unshield_reader_open_volume",0x1d9,
                      "Will read 0x%08x bytes from offset 0x%08x",volume_bytes_left_expanded,
                      volume_bytes_left_compressed);
        volume_bytes_left_expanded._0_4_ = uVar3;
      }
      if ((reader->file_descriptor->flags & 4) == 0) {
        reader->volume_bytes_left = common_header.cab_descriptor_offset;
      }
      else {
        reader->volume_bytes_left = (uint)volume_bytes_left_expanded;
      }
      unshield_fseek(reader->unshield,reader->volume_file,volume_bytes_left_compressed,0);
      reader->volume = volume;
      data_offset._3_1_ = true;
    }
  }
  return data_offset._3_1_;
}

Assistant:

static bool unshield_reader_open_volume(UnshieldReader* reader, int volume)/*{{{*/
{
  bool success = false;
  uint64_t data_offset = 0;
  uint64_t volume_bytes_left_compressed;
  uint64_t volume_bytes_left_expanded;
  CommonHeader common_header;

#if VERBOSE >= 2
  unshield_trace("Open volume %i", volume);
#endif

  FCLOSE(reader->unshield, reader->volume_file);

  reader->volume_file = unshield_fopen_for_reading(reader->unshield, volume, CABINET_SUFFIX);
  if (!reader->volume_file)
  {
    unshield_error("Failed to open input cabinet file %i", volume);
    goto exit;
  }

  {
    uint8_t tmp[COMMON_HEADER_SIZE];
    uint8_t* p = tmp;

    if (COMMON_HEADER_SIZE != unshield_fread(reader->unshield, &tmp, 1, COMMON_HEADER_SIZE, reader->volume_file))
      goto exit;

    if (!unshield_read_common_header(&p, &common_header))
      goto exit;
  }
 
  memset(&reader->volume_header, 0, sizeof(VolumeHeader));

  switch (reader->unshield->header_list->major_version)
  {
    case 0:
    case 5:
      {
        uint8_t five_header[VOLUME_HEADER_SIZE_V5];
        uint8_t* p = five_header;

        if (VOLUME_HEADER_SIZE_V5 !=
            unshield_fread(reader->unshield, &five_header, 1, VOLUME_HEADER_SIZE_V5, reader->volume_file))
          goto exit;

        reader->volume_header.data_offset                = READ_UINT32(p); p += 4;
#if VERBOSE
        if (READ_UINT32(p))
          unshield_trace("Unknown = %08x", READ_UINT32(p));
#endif
        /* unknown */                                                      p += 4;
        reader->volume_header.first_file_index           = READ_UINT32(p); p += 4;
        reader->volume_header.last_file_index            = READ_UINT32(p); p += 4;
        reader->volume_header.first_file_offset          = READ_UINT32(p); p += 4;
        reader->volume_header.first_file_size_expanded   = READ_UINT32(p); p += 4;
        reader->volume_header.first_file_size_compressed = READ_UINT32(p); p += 4;
        reader->volume_header.last_file_offset           = READ_UINT32(p); p += 4;
        reader->volume_header.last_file_size_expanded    = READ_UINT32(p); p += 4;
        reader->volume_header.last_file_size_compressed  = READ_UINT32(p); p += 4;

        if (reader->volume_header.last_file_offset == 0)
          reader->volume_header.last_file_offset = INT32_MAX;
      }
      break;

    case 6:
    case 7:
    case 8:
    case 9:
    case 10:
    case 11:
    case 12:
    case 13:
    default:
      {
        uint8_t six_header[VOLUME_HEADER_SIZE_V6];
        uint8_t* p = six_header;

        if (VOLUME_HEADER_SIZE_V6 !=
            unshield_fread(reader->unshield, &six_header, 1, VOLUME_HEADER_SIZE_V6, reader->volume_file))
          goto exit;

        reader->volume_header.data_offset                       = READ_UINT32(p); p += 4;
        reader->volume_header.data_offset_high                  = READ_UINT32(p); p += 4;
        reader->volume_header.first_file_index                  = READ_UINT32(p); p += 4;
        reader->volume_header.last_file_index                   = READ_UINT32(p); p += 4;
        reader->volume_header.first_file_offset                 = READ_UINT32(p); p += 4;
        reader->volume_header.first_file_offset_high            = READ_UINT32(p); p += 4;
        reader->volume_header.first_file_size_expanded          = READ_UINT32(p); p += 4;
        reader->volume_header.first_file_size_expanded_high     = READ_UINT32(p); p += 4;
        reader->volume_header.first_file_size_compressed        = READ_UINT32(p); p += 4;
        reader->volume_header.first_file_size_compressed_high   = READ_UINT32(p); p += 4;
        reader->volume_header.last_file_offset                  = READ_UINT32(p); p += 4;
        reader->volume_header.last_file_offset_high             = READ_UINT32(p); p += 4;
        reader->volume_header.last_file_size_expanded           = READ_UINT32(p); p += 4;
        reader->volume_header.last_file_size_expanded_high      = READ_UINT32(p); p += 4;
        reader->volume_header.last_file_size_compressed         = READ_UINT32(p); p += 4;
        reader->volume_header.last_file_size_compressed_high    = READ_UINT32(p); p += 4;
      }
      break;
  }
  
#if VERBOSE >= 2
  unshield_trace("First file index = %i, last file index = %i",
      reader->volume_header.first_file_index, reader->volume_header.last_file_index);
  unshield_trace("First file offset = %08x, last file offset = %08x",
      reader->volume_header.first_file_offset, reader->volume_header.last_file_offset);
#endif

  /* enable support for split archives for IS5 */
  if (reader->unshield->header_list->major_version == 5)
  {
    if (reader->index < (reader->unshield->header_list->cab.file_count - 1) &&
        reader->index == reader->volume_header.last_file_index && 
        reader->volume_header.last_file_size_compressed != reader->file_descriptor->compressed_size)
    {
      unshield_trace("IS5 split file last in volume");
      reader->file_descriptor->flags |= FILE_SPLIT;
    }
    else if (reader->index > 0 &&
        reader->index == reader->volume_header.first_file_index && 
        reader->volume_header.first_file_size_compressed != reader->file_descriptor->compressed_size)
    {
      unshield_trace("IS5 split file first in volume");
      reader->file_descriptor->flags |= FILE_SPLIT;
    }
  }

  if (reader->file_descriptor->flags & FILE_SPLIT)
  {   
#if VERBOSE
    unshield_trace(/*"Total bytes left = 0x08%x, "*/"previous data offset = 0x08%x",
        /*total_bytes_left, */data_offset); 
#endif

    if (reader->index == reader->volume_header.last_file_index && reader->volume_header.last_file_offset != 0x7FFFFFFF)
    {
      /* can be first file too... */
#if VERBOSE
      unshield_trace("Index %i is last file in cabinet file %i",
          reader->index, volume);
#endif

      data_offset                   = reader->volume_header.last_file_offset;
      volume_bytes_left_expanded    = reader->volume_header.last_file_size_expanded;
      volume_bytes_left_compressed  = reader->volume_header.last_file_size_compressed;
    }
    else if (reader->index == reader->volume_header.first_file_index)
    {
#if VERBOSE
      unshield_trace("Index %i is first file in cabinet file %i",
          reader->index, volume);
#endif

      data_offset                   = reader->volume_header.first_file_offset;
      volume_bytes_left_expanded    = reader->volume_header.first_file_size_expanded;
      volume_bytes_left_compressed  = reader->volume_header.first_file_size_compressed;
    }
    else
    {
      success = true;
      goto exit;
    }

#if VERBOSE
    unshield_trace("Will read 0x%08x bytes from offset 0x%08x",
        volume_bytes_left_compressed, data_offset);
#endif
  }
  else
  {
    data_offset                  = reader->file_descriptor->data_offset;
    volume_bytes_left_expanded   = reader->file_descriptor->expanded_size;
    volume_bytes_left_compressed = reader->file_descriptor->compressed_size;
  }

  if (reader->file_descriptor->flags & FILE_COMPRESSED)
    reader->volume_bytes_left = volume_bytes_left_compressed;
  else
    reader->volume_bytes_left = volume_bytes_left_expanded;

  unshield_fseek(reader->unshield, reader->volume_file, data_offset, SEEK_SET);

  reader->volume = volume;
  success = true;

exit:
  return success;
}